

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O1

Bitset * __thiscall
spirv_cross::ParsedIR::get_buffer_block_type_flags
          (Bitset *__return_storage_ptr__,ParsedIR *this,SPIRType *type)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  size_t sVar1;
  undefined4 uVar2;
  Meta *pMVar3;
  Bitset *pBVar4;
  size_type sVar5;
  _Hash_node_base *p_Var6;
  ulong uVar7;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  __alloc_node_gen_t __alloc_node_gen;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_70;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  if ((type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
      buffer_size == 0) {
    __return_storage_ptr__->lower = 0;
    (__return_storage_ptr__->higher)._M_h._M_buckets = (__buckets_ptr)0x0;
    (__return_storage_ptr__->higher)._M_h._M_bucket_count = 0;
    (__return_storage_ptr__->higher)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->higher)._M_h._M_element_count = 0;
    *(undefined8 *)&(__return_storage_ptr__->higher)._M_h._M_rehash_policy = 0;
    (__return_storage_ptr__->higher)._M_h._M_rehash_policy._M_next_resize = 0;
    (__return_storage_ptr__->higher)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (__return_storage_ptr__->higher)._M_h._M_buckets =
         &(__return_storage_ptr__->higher)._M_h._M_single_bucket;
    (__return_storage_ptr__->higher)._M_h._M_bucket_count = 1;
    (__return_storage_ptr__->higher)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->higher)._M_h._M_element_count = 0;
    (__return_storage_ptr__->higher)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  }
  else {
    pMVar3 = find_meta(this,(ID)(type->super_IVariant).self.id);
    if ((pMVar3 == (Meta *)0x0) ||
       ((pMVar3->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size == 0)) {
      pBVar4 = &this->cleared_bitset;
    }
    else {
      pBVar4 = &((pMVar3->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr)->
                decoration_flags;
    }
    __return_storage_ptr__->lower = pBVar4->lower;
    this_00 = &__return_storage_ptr__->higher;
    (__return_storage_ptr__->higher)._M_h._M_buckets = (__buckets_ptr)0x0;
    (__return_storage_ptr__->higher)._M_h._M_bucket_count = (pBVar4->higher)._M_h._M_bucket_count;
    (__return_storage_ptr__->higher)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->higher)._M_h._M_element_count = (pBVar4->higher)._M_h._M_element_count;
    uVar2 = *(undefined4 *)&(pBVar4->higher)._M_h._M_rehash_policy.field_0x4;
    sVar1 = (pBVar4->higher)._M_h._M_rehash_policy._M_next_resize;
    (__return_storage_ptr__->higher)._M_h._M_rehash_policy._M_max_load_factor =
         (pBVar4->higher)._M_h._M_rehash_policy._M_max_load_factor;
    *(undefined4 *)&(__return_storage_ptr__->higher)._M_h._M_rehash_policy.field_0x4 = uVar2;
    (__return_storage_ptr__->higher)._M_h._M_rehash_policy._M_next_resize = sVar1;
    (__return_storage_ptr__->higher)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_68._M_buckets = (__buckets_ptr)this_00;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)this_00,&(pBVar4->higher)._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,_false>_>_> *)
               &local_68);
    if (((type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
         buffer_size & 0xfffffffe) != 0) {
      uVar7 = 1;
      do {
        pMVar3 = find_meta(this,(ID)(type->super_IVariant).self.id);
        pBVar4 = &this->cleared_bitset;
        if ((pMVar3 != (Meta *)0x0) &&
           (uVar7 < (pMVar3->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size))
        {
          pBVar4 = &(pMVar3->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr[uVar7].
                    decoration_flags;
        }
        __return_storage_ptr__->lower = __return_storage_ptr__->lower & pBVar4->lower;
        local_68._M_buckets = &local_68._M_single_bucket;
        local_68._M_bucket_count = 1;
        local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_68._M_element_count = 0;
        local_68._M_rehash_policy._M_max_load_factor = 1.0;
        local_68._M_rehash_policy._M_next_resize = 0;
        local_68._M_single_bucket = (__node_base_ptr)0x0;
        p_Var6 = (__return_storage_ptr__->higher)._M_h._M_before_begin._M_nxt;
        if (p_Var6 != (_Hash_node_base *)0x0) {
          do {
            sVar5 = ::std::
                    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::count(&(pBVar4->higher)._M_h,(key_type *)(p_Var6 + 1));
            if (sVar5 != 0) {
              local_70 = &local_68;
              ::std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)&local_68,p_Var6 + 1,&local_70);
            }
            p_Var6 = p_Var6->_M_nxt;
          } while (p_Var6 != (_Hash_node_base *)0x0);
        }
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_move_assign(&this_00->_M_h,&local_68);
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_68);
        uVar7 = uVar7 + 1;
      } while (uVar7 < (uint)(type->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                             buffer_size);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Bitset ParsedIR::get_buffer_block_type_flags(const SPIRType &type) const
{
	if (type.member_types.empty())
		return {};

	Bitset all_members_flags = get_member_decoration_bitset(type.self, 0);
	for (uint32_t i = 1; i < uint32_t(type.member_types.size()); i++)
		all_members_flags.merge_and(get_member_decoration_bitset(type.self, i));
	return all_members_flags;
}